

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(LinkedModel *a,LinkedModel *b)

{
  LinkedModelFile *pLVar1;
  string *psVar2;
  LinkedModelFile *pLVar3;
  size_t sVar4;
  string *psVar5;
  int iVar6;
  StringParameter *pSVar7;
  
  if (a->_oneof_case_[0] != b->_oneof_case_[0]) {
    return false;
  }
  if (a->_oneof_case_[0] != 1) {
    return true;
  }
  pLVar1 = (a->LinkType_).linkedmodelfile_;
  pSVar7 = pLVar1->linkedmodelfilename_;
  if (pSVar7 == (StringParameter *)0x0) {
    pSVar7 = (StringParameter *)&_StringParameter_default_instance_;
  }
  psVar2 = (pSVar7->defaultvalue_).ptr_;
  pLVar3 = (b->LinkType_).linkedmodelfile_;
  pSVar7 = pLVar3->linkedmodelfilename_;
  if (pSVar7 == (StringParameter *)0x0) {
    pSVar7 = (StringParameter *)&_StringParameter_default_instance_;
  }
  sVar4 = psVar2->_M_string_length;
  psVar5 = (pSVar7->defaultvalue_).ptr_;
  if ((sVar4 == psVar5->_M_string_length) &&
     ((sVar4 == 0 ||
      (iVar6 = bcmp((psVar2->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,sVar4), iVar6 == 0)))) {
    pSVar7 = pLVar1->linkedmodelsearchpath_;
    if (pSVar7 == (StringParameter *)0x0) {
      pSVar7 = (StringParameter *)&_StringParameter_default_instance_;
    }
    psVar2 = (pSVar7->defaultvalue_).ptr_;
    pSVar7 = pLVar3->linkedmodelsearchpath_;
    if (pSVar7 == (StringParameter *)0x0) {
      pSVar7 = (StringParameter *)&_StringParameter_default_instance_;
    }
    sVar4 = psVar2->_M_string_length;
    psVar5 = (pSVar7->defaultvalue_).ptr_;
    if (sVar4 == psVar5->_M_string_length) {
      if (sVar4 == 0) {
        return true;
      }
      iVar6 = bcmp((psVar2->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,sVar4);
      if (iVar6 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline LinkedModel::LinkTypeCase LinkedModel::LinkType_case() const {
  return LinkedModel::LinkTypeCase(_oneof_case_[0]);
}